

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward8.c
# Opt level: O0

list_conflict collect(group_conflict g)

{
  group pgVar1;
  list_conflict plVar2;
  list_conflict local_20;
  list_conflict tail;
  list_conflict head;
  group_conflict g_local;
  
  pgVar1 = g->next;
  plVar2 = pgVar1->head;
  local_20 = pgVar1->tail;
  for (head = (list_conflict)pgVar1->next; head != (list_conflict)0x0;
      head = *(list_conflict *)&head->length) {
    local_20->next = (list)head->str;
    local_20 = head->next;
  }
  return plVar2;
}

Assistant:

static list collect(group g)
{
   list head, tail;

   g = g->next;
   head = g->head;
   tail = g->tail;
   for (g = g->next; g; g = g->next) {
      tail->next = g->head;
      tail = g->tail;
   }
   return head;
}